

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DCData_Sequence_Parser.cpp
# Opt level: O0

h__SequenceParser * __thiscall
ASDCP::DCData::SequenceParser::h__SequenceParser::OpenRead(h__SequenceParser *this)

{
  bool bVar1;
  int iVar2;
  iterator iVar3;
  char *pcVar4;
  long lVar5;
  size_type sVar6;
  long in_RSI;
  BytestreamParser local_198 [6];
  allocator<char> local_129;
  undefined1 local_128 [32];
  BytestreamParser local_108 [6];
  undefined1 local_99;
  undefined4 local_98;
  allocator<char> local_91;
  string local_90 [32];
  long local_70;
  fsize_t file_size;
  undefined1 local_58 [8];
  FrameBuffer TmpBuffer;
  BytestreamParser Parser;
  h__SequenceParser *this_local;
  Result_t *result;
  
  bVar1 = std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(in_RSI + 0x10));
  if (bVar1) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_ENDOFFILE);
  }
  else {
    iVar3 = std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(in_RSI + 0x10));
    *(_List_node_base **)(in_RSI + 0x48) = iVar3._M_node;
    BytestreamParser::BytestreamParser
              ((BytestreamParser *)&TmpBuffer.super_FrameBuffer.m_SourceLength);
    FrameBuffer::FrameBuffer((FrameBuffer *)local_58);
    std::
    _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*((_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(in_RSI + 0x48));
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_90,pcVar4,&local_91);
    lVar5 = Kumu::FileSize(local_90);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator(&local_91);
    local_70 = lVar5;
    if (lVar5 == 0) {
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_NOT_FOUND);
    }
    else {
      if (0xffffffff < lVar5) {
        __assert_fail("file_size <= 0xFFFFFFFFL",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/DCData_Sequence_Parser.cpp"
                      ,0x9f,
                      "ASDCP::Result_t ASDCP::DCData::SequenceParser::h__SequenceParser::OpenRead()"
                     );
      }
      local_99 = 0;
      ASDCP::FrameBuffer::Capacity((FrameBuffer *)this,(ui32_t)local_58);
      iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
      if (-1 < iVar2) {
        std::
        _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*((_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(in_RSI + 0x48));
        pcVar4 = (char *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_128,pcVar4,&local_129);
        BytestreamParser::OpenReadFrame
                  ((BytestreamParser *)(local_128 + 0x20),
                   (string *)&TmpBuffer.super_FrameBuffer.m_SourceLength,(FrameBuffer *)local_128);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)(local_128 + 0x20));
        Kumu::Result_t::~Result_t((Result_t *)(local_128 + 0x20));
        std::__cxx11::string::~string((string *)local_128);
        std::allocator<char>::~allocator(&local_129);
      }
      iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
      if (-1 < iVar2) {
        BytestreamParser::FillDCDataDescriptor
                  (local_198,(DCDataDescriptor *)&TmpBuffer.super_FrameBuffer.m_SourceLength);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_198);
        Kumu::Result_t::~Result_t((Result_t *)local_198);
      }
      iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
      if (-1 < iVar2) {
        sVar6 = std::__cxx11::
                list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(in_RSI + 0x10));
        *(int *)(in_RSI + 0x68) = (int)sVar6;
      }
      local_99 = 1;
    }
    local_98 = 1;
    FrameBuffer::~FrameBuffer((FrameBuffer *)local_58);
    BytestreamParser::~BytestreamParser
              ((BytestreamParser *)&TmpBuffer.super_FrameBuffer.m_SourceLength);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::DCData::SequenceParser::h__SequenceParser::OpenRead()
{
  if ( m_FileList.empty() )
    return RESULT_ENDOFFILE;

  m_CurrentFile = m_FileList.begin();
  BytestreamParser Parser;
  FrameBuffer TmpBuffer;

  Kumu::fsize_t file_size = Kumu::FileSize((*m_CurrentFile).c_str());

  if ( file_size == 0 )
    return RESULT_NOT_FOUND;

  assert(file_size <= 0xFFFFFFFFL);
  Result_t result = TmpBuffer.Capacity((ui32_t) file_size);

  if ( ASDCP_SUCCESS(result) )
    result = Parser.OpenReadFrame((*m_CurrentFile).c_str(), TmpBuffer);

  if ( ASDCP_SUCCESS(result) )
    result = Parser.FillDCDataDescriptor(m_DDesc);

  // how big is it?
  if ( ASDCP_SUCCESS(result) )
    m_DDesc.ContainerDuration = m_FileList.size();

  return result;
}